

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void QAnimationTimer::registerAnimation(QAbstractAnimation *animation,bool isTopLevel)

{
  byte bVar1;
  QAnimationTimer *animation_00;
  QAbstractAnimationPrivate *pQVar2;
  byte in_SIL;
  undefined8 in_RDI;
  QAnimationTimer *inst;
  undefined7 in_stack_00000008;
  undefined7 in_stack_fffffffffffffff0;
  ConnectionType c;
  
  c = (ConnectionType)((ulong)in_RDI >> 0x20);
  bVar1 = in_SIL & 1;
  animation_00 = instance(inst._7_1_);
  registerRunningAnimation
            ((QAnimationTimer *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
             (QAbstractAnimation *)animation_00);
  if ((bVar1 & 1) != 0) {
    pQVar2 = QAbstractAnimationPrivate::get((QAbstractAnimation *)0x66a203);
    pQVar2->hasRegisteredTimer = true;
    QList<QAbstractAnimation_*>::operator<<
              ((QList<QAbstractAnimation_*> *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
               (parameter_type)animation_00);
    if ((animation_00->startAnimationPending & 1U) == 0) {
      animation_00->startAnimationPending = true;
      QMetaObject::invokeMethod<>
                ((QObject *)CONCAT17(isTopLevel,in_stack_00000008),
                 (char *)CONCAT17(inst._7_1_,inst._0_7_),c);
    }
  }
  return;
}

Assistant:

void QAnimationTimer::registerAnimation(QAbstractAnimation *animation, bool isTopLevel)
{
    QAnimationTimer *inst = instance(true); //we create the instance if needed
    inst->registerRunningAnimation(animation);
    if (isTopLevel) {
        Q_ASSERT(!QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer);
        QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer = true;
        inst->animationsToStart << animation;
        if (!inst->startAnimationPending) {
            inst->startAnimationPending = true;
            QMetaObject::invokeMethod(inst, "startAnimations", Qt::QueuedConnection);
        }
    }
}